

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool basist::decoder_etc_block::unpack_color5
               (color32 *result,uint16_t packed_color5,uint16_t packed_delta3,bool scaled,
               uint32_t alpha)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  uint uVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  
  uVar7 = CONCAT62(in_register_00000032,packed_color5);
  uVar5 = CONCAT62(in_register_00000012,packed_delta3);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar5 >> 3 & 0x1fffffff | uVar5 << 0x20;
  uVar1 = (uint)(uVar5 >> 6) & 7;
  auVar8 = auVar8 & _DAT_0027d930;
  auVar11._0_4_ = -(uint)(3 < auVar8._0_4_);
  auVar11._4_4_ = -(uint)(3 < auVar8._4_4_);
  auVar11._8_4_ = -(uint)(0 < auVar8._8_4_);
  auVar11._12_4_ = -(uint)(0 < auVar8._12_4_);
  auVar8 = auVar11 & _DAT_0027da40 | auVar8;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar7 >> 5 & 0x7ffffff | uVar7 << 0x20;
  uVar4 = (((uint)(uVar7 >> 10) & 0x1f) + uVar1 + (uint)(uVar1 < 4) * 8) - 8;
  uVar1 = SUB164(auVar9 & _DAT_0027d9b0,0) + auVar8._0_4_;
  uVar10 = SUB164(auVar9 & _DAT_0027d9b0,4) + auVar8._4_4_;
  uVar2 = uVar10 | uVar1 | uVar4;
  if (0x1f < uVar2) {
    uVar6 = 0x1f;
    if ((int)uVar4 < 0x1f) {
      uVar6 = uVar4;
    }
    uVar4 = 0;
    if (0 < (int)uVar6) {
      uVar4 = uVar6;
    }
    uVar1 = (uint)(0x1f < (int)uVar1) * 0x1f | (0x1f >= (int)uVar1) * uVar1;
    uVar10 = (uint)(0x1f < (int)uVar10) * 0x1f | (0x1f >= (int)uVar10) * uVar10;
    uVar1 = (-1 < (int)uVar1) * uVar1;
    uVar10 = (-1 < (int)uVar10) * uVar10;
  }
  if (scaled) {
    uVar1 = (int)uVar1 >> 2 | uVar1 << 3;
    uVar10 = (int)uVar10 >> 2 | uVar10 << 3;
    uVar4 = (int)uVar4 >> 2 | uVar4 * 8;
  }
  (result->field_0).field_0.r = (uint8_t)uVar4;
  (result->field_0).field_0.g = (uint8_t)uVar1;
  (result->field_0).field_0.b = (uint8_t)uVar10;
  uVar3 = 0xff;
  if (alpha < 0xff) {
    uVar3 = alpha;
  }
  (result->field_0).field_0.a = (uint8_t)uVar3;
  return uVar2 < 0x20;
}

Assistant:

static void unpack_delta3(int& r, int& g, int& b, uint16_t packed_delta3)
		{
			r = (packed_delta3 >> 6) & 7;
			g = (packed_delta3 >> 3) & 7;
			b = packed_delta3 & 7;
			if (r >= 4) r -= 8;
			if (g >= 4) g -= 8;
			if (b >= 4) b -= 8;
		}